

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

bool storage::BTree::check_(BTNode *nd)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  BTNode::get_right_brother(nd);
  BTNode::get_left_brother(nd);
  iVar2 = nd->used_links_count_;
  if (iVar2 < 3) {
LAB_001059d5:
    if (nd->parent_ == (BTNode *)0x0) {
      if (iVar2 < 2) {
        return false;
      }
    }
    else if (iVar2 < 0x19) {
      return false;
    }
    iVar2 = (**nd->_vptr_BTNode)(nd);
    bVar1 = true;
    if (((char)iVar2 == '\0') &&
       (lVar3 = __dynamic_cast(nd,&BTNode::typeinfo,&BTInnerNode::typeinfo,0),
       0 < *(int *)(lVar3 + 0xdc))) {
      lVar5 = 0;
      do {
        bVar1 = check_(*(BTNode **)(lVar3 + 0xe0 + lVar5 * 8));
        if (!bVar1) {
          return bVar1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < *(int *)(lVar3 + 0xdc));
    }
    return bVar1;
  }
  if (nd->keys_[0] < nd->keys_[1]) {
    lVar3 = 0;
    iVar4 = nd->keys_[1];
    do {
      lVar5 = lVar3;
      if ((ulong)(iVar2 - 1) - 2 == lVar5) break;
      bVar1 = iVar4 < nd->keys_[lVar5 + 2];
      lVar3 = lVar5 + 1;
      iVar4 = nd->keys_[lVar5 + 2];
    } while (bVar1);
    if ((ulong)(iVar2 - 1) <= lVar5 + 2U) goto LAB_001059d5;
  }
  __assert_fail("cc(nd->keys_, nd->key_count())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                ,0x160,"static bool storage::BTree::check_(BTNode *)");
}

Assistant:

bool BTree::check_(BTNode *nd) {
        nd->get_right_brother();
        nd->get_left_brother();
        assert(cc(nd->keys_, nd->key_count()));
        BTNode *node = nd;
        if (!node->parent_) {
            if (node->used_links_count_ < 2)
                return false;
        } else {
            if (!node->check())
                return false;
        }
        if (!node->is_leaf_node()) {
            auto inner_node = dynamic_cast<BTInnerNode *>(node);
            for (int i = 0; i < inner_node->used_links_count_; ++i) {
                if (!check_(inner_node->links_[i]))
                    return false;
            }
        }
        return true;
    }